

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_7::Validator::CheckExceptVar(Validator *this,Var *var,Exception **out_except)

{
  Result RVar1;
  Enum EVar2;
  uint local_1c [2];
  Index index;
  
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->excepts).
                                              super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->excepts).
                                             super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "except",local_1c);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    EVar2 = Ok;
    if (out_except != (Exception **)0x0) {
      *out_except = (this->current_module_->excepts).
                    super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_1c[0]];
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckExceptVar(const Var* var, const Exception** out_except) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->excepts.size(), var, "except", &index));
  if (out_except) {
    *out_except = current_module_->excepts[index];
  }
  return Result::Ok;
}